

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O0

bool __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::CheckAll(BlendMaskStateMachine *this)

{
  bool bVar1;
  size_type sVar2;
  uint local_1c;
  uint i;
  BlendMaskStateMachine *this_local;
  
  local_1c = 0;
  while( true ) {
    sVar2 = std::
            vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
            ::size(&this->state);
    if (sVar2 <= local_1c) {
      return true;
    }
    bVar1 = CheckBuffer(this,local_1c);
    if (!bVar1) break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool DrawBuffersIndexedBase::BlendMaskStateMachine::CheckAll()
{
	for (unsigned int i = 0; i < state.size(); ++i)
	{
		if (!CheckBuffer(i))
		{
			return false;
		}
	}
	return true;
}